

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_terminate(void)

{
  long lVar1;
  long lVar2;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (GAinitialized == '\x01') {
    sai_terminate_sparse_arrays();
    if (0 < _max_global_array) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        if (*(int *)((long)GA->dims + lVar2 + -0x28) != 0) {
          pnga_destroy(lVar1 + -1000);
        }
        if (*(void **)(GA->name + lVar2 + -0x10) != (void *)0x0) {
          free(*(void **)(GA->name + lVar2 + -0x10));
        }
        if (*(void **)(GA->name + lVar2 + -8) != (void *)0x0) {
          free(*(void **)(GA->name + lVar2 + -8));
        }
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x368;
      } while (lVar1 < _max_global_array);
    }
    if (0 < _max_global_array) {
      lVar1 = 0x10;
      lVar2 = 0;
      do {
        if (*(int *)((long)PGRP_LIST + lVar1 + -8) != 0) {
          free(*(void **)((long)&PGRP_LIST->mirrored + lVar1));
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x28;
      } while (lVar2 < _max_global_array);
    }
    pnga_sync();
    GA_total_memory = -1;
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);
    pnga_sync();
    ARMCI_Finalize();
    MPI_Comm_free(&GA_MPI_World_comm_dup);
    ARMCIinitialized = 0;
    GAinitialized = '\0';
  }
  return;
}

Assistant:

void pnga_terminate() 
{
    //GA_Internal_Threadsafe_Lock();
Integer i, handle;

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(!GAinitialized)
    {
        //GA_Internal_Threadsafe_Unlock();
        return;
    }

    sai_terminate_sparse_arrays();
#ifdef PROFILE_OLD 
    ga_profile_terminate();
#endif
    for (i=0;i<_max_global_array;i++){
          handle = i - GA_OFFSET ;
          if(GA[i].actv) pnga_destroy(handle);
          if(GA[i].ptr) free(GA[i].ptr);
          if(GA[i].mapc) free(GA[i].mapc);
    }
    /* don't free groups list until all arrays destroyed */
    for (i=0;i<_max_global_array;i++){
          if(PGRP_LIST[i].actv) free(PGRP_LIST[i].map_proc_list);
    }
    pnga_sync();

    GA_total_memory = -1; /* restore "unlimited" memory usage status */
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);

    pnga_sync();
    ARMCI_Finalize();
#ifdef MSG_COMMS_MPI
    MPI_Comm_free(&GA_MPI_World_comm_dup);
#endif
    ARMCIinitialized = 0;
    GAinitialized = 0;
    //GA_Internal_Threadsafe_Unlock();
}